

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444_writer.c
# Opt level: O0

void rfc5444_writer_unregister_addrtlvtype(rfc5444_writer *writer,rfc5444_writer_tlvtype *tlvtype)

{
  list_entity *plVar1;
  list_entity *plVar2;
  bool bVar3;
  rfc5444_writer_tlvtype *tlvtype_local;
  rfc5444_writer *writer_local;
  
  if (writer->_state != RFC5444_WRITER_NONE) {
    __assert_fail("writer->_state == RFC5444_WRITER_NONE",
                  "/workspace/llm4binary/github/license_c_cmakelists/OLSR[P]OONF/src/librfc5444/rfc5444_writer.c"
                  ,0x137,
                  "void rfc5444_writer_unregister_addrtlvtype(struct rfc5444_writer *, struct rfc5444_writer_tlvtype *)"
                 );
  }
  bVar3 = false;
  if ((tlvtype->_tlvtype_node).next != (list_entity *)0x0) {
    bVar3 = (tlvtype->_tlvtype_node).prev != (list_entity *)0x0;
  }
  if (bVar3) {
    plVar1 = (tlvtype->_tlvtype_node).prev;
    plVar2 = (tlvtype->_tlvtype_node).next;
    plVar1->next = plVar2;
    plVar2->prev = plVar1;
    (tlvtype->_tlvtype_node).prev = (list_entity *)0x0;
    (tlvtype->_tlvtype_node).next = (list_entity *)0x0;
    if (tlvtype->_creator != (rfc5444_writer_message *)0x0) {
      _lazy_free_message(writer,tlvtype->_creator);
    }
  }
  return;
}

Assistant:

void
rfc5444_writer_unregister_addrtlvtype(struct rfc5444_writer *writer, struct rfc5444_writer_tlvtype *tlvtype) {
#if WRITER_STATE_MACHINE == true
  assert(writer->_state == RFC5444_WRITER_NONE);
#endif
  if (!list_is_node_added(&tlvtype->_tlvtype_node)) {
    return;
  }

  list_remove(&tlvtype->_tlvtype_node);

  if (tlvtype->_creator) {
    /* message specific address tlv, see if we need to remove the message itself */
    _lazy_free_message(writer, tlvtype->_creator);
  }
}